

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
FxClassTypeCast::FxClassTypeCast(FxClassTypeCast *this,PClassPointer *dtype,FxExpression *x)

{
  FxExpression::FxExpression(&this->super_FxExpression,EFX_ClassTypeCast,&x->ScriptPosition);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxClassTypeCast_00707198;
  (this->super_FxExpression).ValueType = (PType *)dtype;
  this->desttype = dtype->ClassRestriction;
  this->basex = x;
  return;
}

Assistant:

FxClassTypeCast::FxClassTypeCast(PClassPointer *dtype, FxExpression *x)
: FxExpression(EFX_ClassTypeCast, x->ScriptPosition)
{
	ValueType = dtype;
	desttype = dtype->ClassRestriction;
	basex=x;
}